

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotBarsHEx<ImPlot::GetterXsYs<signed_char>,double>
               (char *label_id,GetterXsYs<signed_char> *getter,double height)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  ImPlotPlot *pIVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  ImPlotContext *pIVar17;
  bool bVar18;
  ImU32 col;
  ImU32 col_00;
  ImDrawList *this;
  int iVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  ImPlotRange *pIVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ImPlotRange IVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  ImVec2 b;
  ImVec2 a;
  byte local_44;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar18 = BeginItem(label_id,1);
  pIVar17 = GImPlot;
  if (bVar18) {
    dVar32 = height * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar19 = getter->Count, 0 < iVar19)) {
      pcVar8 = getter->Xs;
      pcVar9 = getter->Ys;
      iVar22 = getter->Offset;
      iVar4 = getter->Stride;
      pIVar10 = GImPlot->CurrentPlot;
      iVar5 = pIVar10->CurrentYAxis;
      uVar6 = (pIVar10->XAxis).Flags;
      pIVar23 = GImPlot->ExtentsY + iVar5;
      uVar7 = pIVar10->YAxis[iVar5].Flags;
      iVar21 = 0;
      do {
        lVar20 = (long)(((iVar22 + iVar21) % iVar19 + iVar19) % iVar19) * (long)iVar4;
        cVar1 = pcVar8[lVar20];
        cVar2 = pcVar9[lVar20];
        dVar13 = (double)(int)cVar2 - dVar32;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((uVar6 & 0x20) == 0) {
LAB_001f869f:
            dVar14 = (pIVar17->ExtentsX).Min;
            dVar15 = (pIVar17->ExtentsX).Max;
            IVar29.Min = (double)(-(ulong)(dVar14 <= 0.0) & (ulong)dVar14);
            IVar29.Max = (double)(-(ulong)(0.0 <= dVar15) & (ulong)dVar15);
            pIVar17->ExtentsX = IVar29;
          }
        }
        else if ((((uVar6 & 0x20) == 0) && (pIVar10->YAxis[iVar5].Range.Min <= dVar13)) &&
                (dVar13 <= pIVar10->YAxis[iVar5].Range.Max)) goto LAB_001f869f;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((long)ABS(dVar13) < 0x7ff0000000000000) {
LAB_001f86ff:
            if ((0.0 < dVar13) || ((uVar7 & 0x20) == 0)) {
              dVar14 = pIVar17->ExtentsY[iVar5].Max;
              uVar25 = -(ulong)(dVar13 < pIVar23->Min);
              uVar26 = -(ulong)(dVar14 < dVar13);
              uVar24 = (ulong)dVar13 & uVar26;
              auVar30._0_8_ = ~uVar25 & (ulong)pIVar23->Min;
              auVar30._8_8_ = ~uVar26 & (ulong)dVar14;
              auVar12._8_4_ = (int)uVar24;
              auVar12._0_8_ = (ulong)dVar13 & uVar25;
              auVar12._12_4_ = (int)(uVar24 >> 0x20);
              *pIVar23 = (ImPlotRange)(auVar30 | auVar12);
            }
          }
        }
        else if ((((long)ABS(dVar13) < 0x7ff0000000000000) && ((pIVar10->XAxis).Range.Min <= 0.0))
                && (0.0 <= (pIVar10->XAxis).Range.Max)) goto LAB_001f86ff;
        dVar14 = (double)(int)cVar1;
        dVar13 = (double)(int)cVar2 + dVar32;
        if ((uVar6 >> 10 & 1) == 0) {
          if (('\0' < cVar1) || ((uVar6 & 0x20) == 0)) {
LAB_001f8778:
            dVar15 = (pIVar17->ExtentsX).Min;
            dVar16 = (pIVar17->ExtentsX).Max;
            uVar24 = -(ulong)(dVar14 < dVar15);
            uVar25 = -(ulong)(dVar16 < dVar14);
            auVar27._0_8_ = (ulong)dVar14 & uVar24;
            auVar27._8_8_ = (ulong)dVar14 & uVar25;
            auVar31._0_8_ = ~uVar24 & (ulong)dVar15;
            auVar31._8_8_ = ~uVar25 & (ulong)dVar16;
            pIVar17->ExtentsX = (ImPlotRange)(auVar31 | auVar27);
          }
        }
        else if (((pIVar10->YAxis[iVar5].Range.Min <= dVar13) &&
                 (dVar13 <= pIVar10->YAxis[iVar5].Range.Max)) &&
                (local_44 = (byte)((uVar6 & 0x20) >> 5), (cVar1 < '\x01' & local_44) == 0))
        goto LAB_001f8778;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((long)ABS(dVar13) < 0x7ff0000000000000) {
LAB_001f87eb:
            if ((0.0 < dVar13) || ((uVar7 & 0x20) == 0)) {
              dVar14 = pIVar17->ExtentsY[iVar5].Max;
              uVar25 = -(ulong)(dVar13 < pIVar23->Min);
              uVar26 = -(ulong)(dVar14 < dVar13);
              uVar24 = (ulong)dVar13 & uVar26;
              auVar28._0_8_ = ~uVar25 & (ulong)pIVar23->Min;
              auVar28._8_8_ = ~uVar26 & (ulong)dVar14;
              auVar11._8_4_ = (int)uVar24;
              auVar11._0_8_ = (ulong)dVar13 & uVar25;
              auVar11._12_4_ = (int)(uVar24 >> 0x20);
              *pIVar23 = (ImPlotRange)(auVar28 | auVar11);
            }
          }
        }
        else if ((((long)ABS(dVar13) < 0x7ff0000000000000) && ((pIVar10->XAxis).Range.Min <= dVar14)
                 ) && (dVar14 <= (pIVar10->XAxis).Range.Max)) goto LAB_001f87eb;
        iVar21 = iVar21 + 1;
      } while (iVar19 != iVar21);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar17->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar17->NextItemData).Colors + 1);
    iVar19 = getter->Count;
    if (0 < iVar19) {
      bVar18 = (pIVar17->NextItemData).RenderFill;
      bVar3 = (pIVar17->NextItemData).RenderLine;
      iVar22 = 0;
      do {
        lVar20 = (long)(((getter->Offset + iVar22) % iVar19 + iVar19) % iVar19) *
                 (long)getter->Stride;
        cVar1 = getter->Xs[lVar20];
        if (cVar1 != '\0') {
          cVar2 = getter->Ys[lVar20];
          local_38 = PlotToPixels(0.0,(double)(int)cVar2 - dVar32,-1);
          local_40 = PlotToPixels((double)(int)cVar1,(double)(int)cVar2 + dVar32,-1);
          if ((pIVar17->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar18 ^ 1U | col != col_00) & bVar3) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar17->NextItemData).LineWeight);
          }
          iVar19 = getter->Count;
        }
        iVar22 = iVar22 + 1;
      } while (iVar22 < iVar19);
    }
    pIVar17 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar17->NextItemData);
    pIVar17->PreviousItem = pIVar17->CurrentItem;
    pIVar17->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsHEx(const char* label_id, const Getter& getter, THeight height) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const THeight half_height = height / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(0, p.y - half_height));
                FitPoint(ImPlotPoint(p.x, p.y + half_height));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.x == 0)
                continue;
            ImVec2 a = PlotToPixels(0, p.y - half_height);
            ImVec2 b = PlotToPixels(p.x, p.y + half_height);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}